

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O3

void __thiscall
S2Polygon::InitToOperation
          (S2Polygon *this,OpType op_type,SnapFunction *snap_function,S2Polygon *a,S2Polygon *b)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  ostream *os;
  S2Error error;
  S2LogMessage SStack_48;
  S2Error local_38;
  
  paVar1 = &local_38.text_.field_2;
  local_38.code_ = OK;
  local_38.text_._M_string_length = 0;
  local_38.text_.field_2._M_local_buf[0] = '\0';
  local_38.text_._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = InitToOperation(this,op_type,snap_function,a,b,&local_38);
  if (bVar2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38.text_._M_dataplus._M_p != paVar1) {
      operator_delete(local_38.text_._M_dataplus._M_p);
    }
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x372,kFatal,(ostream *)&std::cerr);
  pcVar3 = S2BooleanOperation::OpTypeToString(op_type);
  os = std::operator<<(SStack_48.stream_,pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>(os," operation failed: ",0x13);
  ::operator<<(os,&local_38);
  abort();
}

Assistant:

void S2Polygon::InitToOperation(S2BooleanOperation::OpType op_type,
                                const S2Builder::SnapFunction& snap_function,
                                const S2Polygon& a, const S2Polygon& b) {
  S2Error error;
  if (!InitToOperation(op_type, snap_function, a, b, &error)) {
    S2_LOG(DFATAL) << S2BooleanOperation::OpTypeToString(op_type)
                << " operation failed: " << error;
  }
}